

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O1

uint __thiscall
Kernel::Signature::addLinMul<Kernel::RealConstantType>(Signature *this,RealConstantType *number)

{
  Symbol ***pppSVar1;
  SymbolMap *this_00;
  Symbol **ppSVar2;
  Symbol **ppSVar3;
  undefined1 auVar4 [8];
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar5;
  LinMulSym<Kernel::RealConstantType> *this_01;
  TermList TVar6;
  OperatorKey *key_00;
  OperatorType *type;
  size_type extraout_RDX;
  uint uVar7;
  pair<Kernel::RealConstantType,_unsigned_int> *b;
  uint uVar8;
  initializer_list<Kernel::TermList> sorts;
  anon_class_16_2_d708292f f;
  SymbolKey key;
  anon_class_1_0_00000001 local_109;
  undefined1 local_108 [8];
  RealConstantType local_100;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  local_e0;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  local_b4;
  pair<Kernel::RealConstantType,_unsigned_int> local_88;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  local_5c;
  
  b = &local_88;
  RealConstantType::RealConstantType(&b->first,number);
  local_88.second = 1;
  ::Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::Coproduct<std::pair<Kernel::RealConstantType,_unsigned_int>,_0>(&local_b4,b);
  mpz_clear(local_88.first.super_RationalConstantType._den._val);
  mpz_clear((__mpz_struct *)&local_88);
  ::Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  ::DefaultImpl(&local_5c,&local_b4._inner);
  this_00 = &this->_funNames;
  ::Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::tryGet((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
            *)local_108,
           (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            *)this_00);
  auVar4 = local_108;
  if (local_108 != (undefined1  [8])0x0) {
    b = (pair<Kernel::RealConstantType,_unsigned_int> *)(ulong)*(uint *)local_108;
  }
  uVar7 = (uint)b;
  ::Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)&local_5c,(anon_class_8_1_8991fb9c)&local_5c);
  if (auVar4 == (undefined1  [8])0x0) {
    this->_reals = this->_reals + 1;
    ppSVar2 = (this->_funs)._cursor;
    ppSVar3 = (this->_funs)._stack;
    this_01 = (LinMulSym<Kernel::RealConstantType> *)::operator_new(0x70);
    RealConstantType::RealConstantType(&local_100,number);
    LinMulSym<Kernel::RealConstantType>::LinMulSym(this_01,&local_100);
    mpz_clear(local_100.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_100);
    TVar6 = AtomicSort::realSort();
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x1;
    local_108 = (undefined1  [8])TVar6;
    key_00 = OperatorType::setupKey((OperatorType *)local_108,sorts);
    *(uint64_t *)(key_00 + 0x10) = TVar6._content;
    type = OperatorType::getTypeFromKey(key_00,0);
    Symbol::setType((Symbol *)this_01,type);
    if ((this->_funs)._cursor == (this->_funs)._end) {
      ::Lib::Stack<Kernel::Signature::Symbol_*>::expand(&this->_funs);
    }
    *(this->_funs)._cursor = (Symbol *)this_01;
    pppSVar1 = &(this->_funs)._cursor;
    *pppSVar1 = *pppSVar1 + 1;
    ::Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
    ::DefaultImpl(&local_e0._inner,&local_b4._inner);
    uVar7 = (uint)((ulong)((long)ppSVar2 - (long)ppSVar3) >> 3);
    local_108._0_4_ = uVar7;
    if ((this->_funNames)._maxEntries <= (this->_funNames)._noOfEntries) {
      ::Lib::
      Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
      ::expand(this_00);
    }
    f.this = &local_e0;
    f.f = &local_109;
    RVar5 = ::Lib::CoproductImpl::
            RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            ::
            switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                      ((RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                        *)&local_e0,f);
    uVar8 = (byte)local_e0._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>
                  .
                  super_RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                  ._0_1_ & 7;
    uVar8 = (uVar8 >> 2) + RVar5 + uVar8 * 0x40 + 0x9e3779b9 ^ uVar8;
    ::Lib::
    Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
    ::insert(this_00,&local_e0,(uint *)local_108,uVar8 + (uVar8 == 0));
    ::Lib::CoproductImpl::
    RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
                *)&local_e0,(anon_class_8_1_8991fb9c)&local_e0);
  }
  ::Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)&local_b4,(anon_class_8_1_8991fb9c)&local_b4);
  return uVar7;
}

Assistant:

unsigned addLinMul(Numeral const& number) {
    auto key = SymbolKey(std::make_pair(number, unsigned(1)));
    unsigned result;
    if (_funNames.find(key, result)) {
      return result;
    }
    noteOccurrence(number);
    result = _funs.length();
    Symbol* sym = new LinMulSym<Numeral>(number);
    auto s = AnyLinMulSym::sortOf<Numeral>();
    sym->setType(OperatorType::getFunctionType({s}, s));
    _funs.push(sym);
    _funNames.insert(key,result);
    return result;
  }